

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
llvm::SmallVector<llbuild::buildsystem::BuildKey,_1U>::~SmallVector
          (SmallVector<llbuild::buildsystem::BuildKey,_1U> *this)

{
  BuildKey *S;
  
  S = (BuildKey *)
      (this->super_SmallVectorImpl<llbuild::buildsystem::BuildKey>).
      super_SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false>.
      super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>.super_SmallVectorBase.
      BeginX;
  SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false>::destroy_range
            (S,S + (this->super_SmallVectorImpl<llbuild::buildsystem::BuildKey>).
                   super_SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false>.
                   super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>.
                   super_SmallVectorBase.Size);
  SmallVectorImpl<llbuild::buildsystem::BuildKey>::~SmallVectorImpl
            (&this->super_SmallVectorImpl<llbuild::buildsystem::BuildKey>);
  return;
}

Assistant:

~SmallVector() {
    // Destroy the constructed elements in the vector.
    this->destroy_range(this->begin(), this->end());
  }